

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPSocket.cpp
# Opt level: O1

void __thiscall net_uv::KCPSocket::connectResult(KCPSocket *this,int32_t status)

{
  uint64_t uVar1;
  int32_t local_1c;
  KCPSocket *local_18;
  
  if ((this->super_Socket).m_connectCall.super__Function_base._M_manager != (_Manager_type)0x0) {
    local_1c = status;
    local_18 = this;
    (*(this->super_Socket).m_connectCall._M_invoker)
              ((_Any_data *)&(this->super_Socket).m_connectCall,(Socket **)&local_18,&local_1c);
  }
  if (status != 1) {
    this->m_kcpState = CLOSED;
    uVar1 = uv_now((this->super_Socket).m_loop);
    this->m_stateTimeStamp = uVar1;
    shutdownSocket(this);
  }
  return;
}

Assistant:

void KCPSocket::connectResult(int32_t status)
{
	if (m_connectCall)
		m_connectCall(this, status);

	if (status != 1)
	{
		this->changeState(State::CLOSED);
		this->shutdownSocket();
	}
}